

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_print_glossary_gnu_ds(arg_dstr_t ds,void **argtable)

{
  char *shortopts_00;
  char *longopts_00;
  char *datatype_00;
  char *text;
  size_t sVar1;
  char *glossary;
  char *datatype;
  char *longopts;
  char *shortopts;
  char syntax [200];
  int local_24;
  int tabindex;
  arg_hdr **table;
  void **argtable_local;
  arg_dstr_t ds_local;
  
  local_24 = 0;
  while ((*argtable[local_24] & 1) == 0) {
    if (*(long *)((long)argtable[local_24] + 0x20) != 0) {
      memset(&shortopts,0,200);
      shortopts_00 = *(char **)((long)argtable[local_24] + 8);
      longopts_00 = *(char **)((long)argtable[local_24] + 0x10);
      datatype_00 = *(char **)((long)argtable[local_24] + 0x18);
      text = *(char **)((long)argtable[local_24] + 0x20);
      if ((shortopts_00 == (char *)0x0) && (longopts_00 != (char *)0x0)) {
        memset(&shortopts,0x20,4);
        shortopts._4_1_ = 0;
      }
      arg_cat_optionv((char *)&shortopts,199,shortopts_00,longopts_00,datatype_00,
                      (int)*argtable[local_24] & 4,", ");
      sVar1 = strlen((char *)&shortopts);
      if (0x19 < sVar1) {
        arg_dstr_catf(ds,"  %-25s %s\n",&shortopts,"");
        shortopts._0_1_ = 0;
      }
      arg_dstr_catf(ds,"  %-25s ",&shortopts);
      arg_print_formatted_ds(ds,0x1c,0x4f,text);
    }
    local_24 = local_24 + 1;
  }
  arg_dstr_cat(ds,"\n");
  return;
}

Assistant:

void arg_print_glossary_gnu_ds(arg_dstr_t ds, void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int tabindex;

    for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        if (table[tabindex]->glossary) {
            char syntax[200] = "";
            const char* shortopts = table[tabindex]->shortopts;
            const char* longopts = table[tabindex]->longopts;
            const char* datatype = table[tabindex]->datatype;
            const char* glossary = table[tabindex]->glossary;

            if (!shortopts && longopts) {
                /* Indent trailing line by 4 spaces... */
                memset(syntax, ' ', 4);
                *(syntax + 4) = '\0';
            }

            arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE, ", ");

            /* If syntax fits not into column, print glossary in new line... */
            if (strlen(syntax) > 25) {
                arg_dstr_catf(ds, "  %-25s %s\n", syntax, "");
                *syntax = '\0';
            }

            arg_dstr_catf(ds, "  %-25s ", syntax);
            arg_print_formatted_ds(ds, 28, 79, glossary);
        }
    } /* for each table entry */

    arg_dstr_cat(ds, "\n");
}